

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpege_api_v2.c
# Opt level: O0

MPP_RET jpege_proc_jpeg_cfg(MppEncJpegCfg *dst,MppEncJpegCfg *src,MppEncRcCfg *rc)

{
  uint uVar1;
  char *pcVar2;
  RK_U8 *pRVar3;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 uVar4;
  undefined4 uVar5;
  uint local_68;
  uint local_64;
  RK_U32 j;
  RK_U32 i;
  MppEncJpegCfg bak;
  RK_U32 change;
  MPP_RET ret;
  MppEncRcCfg *rc_local;
  MppEncJpegCfg *src_local;
  MppEncJpegCfg *dst_local;
  
  bak.qtable_v._4_4_ = MPP_OK;
  bak.qtable_v._0_4_ = src->change;
  if ((RK_U32)bak.qtable_v != 0) {
    memcpy(&j,dst,0x30);
    uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    if (((RK_U32)bak.qtable_v & 1) == 0) {
      if (((RK_U32)bak.qtable_v & 4) == 0) {
        if (((RK_U32)bak.qtable_v & 2) != 0) {
          if (((src->qtable_y == (RK_U8 *)0x0) || (src->qtable_u == (RK_U8 *)0x0)) ||
             (src->qtable_v == (RK_U8 *)0x0)) {
            pRVar3 = src->qtable_v;
            _mpp_log_l(2,"jpege_api_v2","invalid qtable y %p u %p v %p\n","jpege_proc_jpeg_cfg",
                       src->qtable_y,src->qtable_u,pRVar3);
            uVar5 = (undefined4)((ulong)pRVar3 >> 0x20);
            bak.qtable_v._4_4_ = MPP_ERR_NULL_PTR;
          }
          else {
            if (dst->qtable_y == (RK_U8 *)0x0) {
              pRVar3 = (RK_U8 *)mpp_osal_malloc("jpege_proc_jpeg_cfg",0x40);
              dst->qtable_y = pRVar3;
            }
            if (dst->qtable_u == (RK_U8 *)0x0) {
              pRVar3 = (RK_U8 *)mpp_osal_malloc("jpege_proc_jpeg_cfg",0x40);
              dst->qtable_u = pRVar3;
            }
            uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
            if ((dst->qtable_y == (RK_U8 *)0x0) || (dst->qtable_u == (RK_U8 *)0x0)) {
              _mpp_log_l(2,"jpege_api_v2","qtable is null, malloc err\n","jpege_proc_jpeg_cfg");
              return MPP_ERR_MALLOC;
            }
            if (src->qtable_u != src->qtable_v) {
              local_64 = 0;
LAB_0021cf6e:
              if (local_64 < 0x40) {
                if (src->qtable_u[local_64] == src->qtable_v[local_64]) goto LAB_0021d04f;
                if ((jpege_debug & 0x10) != 0) {
                  _mpp_log_l(4,"jpege_api_v2","qtable_u and qtable_v are different, use qtable_u\n",
                             (char *)0x0);
                }
                for (local_68 = 0; uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                    local_68 < 0x40; local_68 = local_68 + 1) {
                  if ((jpege_debug & 0x10) != 0) {
                    in_stack_ffffffffffffff78 = CONCAT44(uVar5,local_68);
                    _mpp_log_l(4,"jpege_api_v2","qtable_u[%d] %d qtable_v[%d] %d\n",(char *)0x0,
                               (ulong)local_68,(ulong)src->qtable_u[local_68],
                               in_stack_ffffffffffffff78,(uint)src->qtable_v[local_68]);
                  }
                }
              }
            }
            memcpy(dst->qtable_y,src->qtable_y,0x40);
            memcpy(dst->qtable_u,src->qtable_u,0x40);
            if (rc->rc_mode != MPP_ENC_RC_MODE_FIXQP) {
              pcVar2 = strof_rc_mode(rc->rc_mode);
              _mpp_log_l(4,"jpege_api_v2","setup qtable will change mode %s fixqp",(char *)0x0,
                         pcVar2);
              rc->rc_mode = MPP_ENC_RC_MODE_FIXQP;
            }
          }
        }
      }
      else {
        if ((src->q_factor < 1) || (99 < src->q_factor)) {
          _mpp_log_l(2,"jpege_api_v2","q_factor out of range, default set 80\n",
                     "jpege_proc_jpeg_cfg");
          src->q_factor = 0x50;
        }
        if (dst->q_factor != src->q_factor) {
          bak.qtable_v._4_4_ = jpege_gen_qt_by_qfactor(dst,&src->q_factor);
        }
        dst->q_factor = src->q_factor;
        if ((src->qf_min < 1) || (99 < src->qf_min)) {
          _mpp_log_l(2,"jpege_api_v2","qf_min out of range, default set 1\n","jpege_proc_jpeg_cfg");
          src->qf_min = 1;
        }
        dst->qf_min = src->qf_min;
        if ((src->qf_max < 1) || (99 < src->qf_max)) {
          _mpp_log_l(2,"jpege_api_v2","qf_max out of range, default set 99\n","jpege_proc_jpeg_cfg")
          ;
          src->qf_max = 99;
        }
        dst->qf_max = src->qf_max;
        if ((jpege_debug & 0x10) != 0) {
          uVar4 = CONCAT44(uVar5,dst->qf_max);
          _mpp_log_l(4,"jpege_api_v2","q_factor %d, qf_min %d, qf_max %d\n",(char *)0x0,
                     (ulong)(uint)dst->q_factor,(ulong)(uint)dst->qf_min,uVar4);
          uVar5 = (undefined4)((ulong)uVar4 >> 0x20);
        }
      }
    }
    else {
      dst->quant = src->quant;
      if ((dst->quant < 0) || (10 < dst->quant)) {
        _mpp_log_l(2,"jpege_api_v2",
                   "invalid quality level %d is not in range [0..10] set to default 8\n",
                   "jpege_proc_jpeg_cfg");
        dst->quant = 8;
      }
      if (rc->rc_mode != MPP_ENC_RC_MODE_FIXQP) {
        uVar1 = dst->quant;
        pcVar2 = strof_rc_mode(rc->rc_mode);
        _mpp_log_l(4,"jpege_api_v2","setup quant %d change mode %s fixqp",(char *)0x0,(ulong)uVar1,
                   pcVar2);
        rc->rc_mode = MPP_ENC_RC_MODE_FIXQP;
      }
    }
    if (bak.qtable_v._4_4_ == MPP_OK) {
      if ((jpege_debug & 0x40) != 0) {
        _mpp_log_l(4,"jpege_api_v2","MPP_ENC_SET_CODEC_CFG change 0x%x jpeg quant %d q_factor %d\n",
                   (char *)0x0,(ulong)(RK_U32)bak.qtable_v,(ulong)(uint)dst->quant,
                   CONCAT44(uVar5,dst->q_factor));
      }
      dst->change = src->change;
    }
    else {
      _mpp_log_l(2,"jpege_api_v2","failed to accept new rc config\n","jpege_proc_jpeg_cfg");
      memcpy(dst,&j,0x30);
    }
    dst->change = src->change;
  }
  return bak.qtable_v._4_4_;
LAB_0021d04f:
  local_64 = local_64 + 1;
  goto LAB_0021cf6e;
}

Assistant:

static MPP_RET jpege_proc_jpeg_cfg(MppEncJpegCfg *dst, MppEncJpegCfg *src, MppEncRcCfg *rc)
{
    MPP_RET ret = MPP_OK;
    RK_U32 change = src->change;

    if (change) {
        MppEncJpegCfg bak = *dst;

        if (change & MPP_ENC_JPEG_CFG_CHANGE_QP) {
            dst->quant = src->quant;
            if (dst->quant < 0 || dst->quant > 10) {
                mpp_err_f("invalid quality level %d is not in range [0..10] set to default 8\n");
                dst->quant = 8;
            }

            if (rc->rc_mode != MPP_ENC_RC_MODE_FIXQP) {
                mpp_log("setup quant %d change mode %s fixqp", dst->quant,
                        strof_rc_mode(rc->rc_mode));
                rc->rc_mode = MPP_ENC_RC_MODE_FIXQP;
            }
        } else if (change & MPP_ENC_JPEG_CFG_CHANGE_QFACTOR) {
            if (src->q_factor < 1 || src->q_factor > 99) {
                mpp_err_f("q_factor out of range, default set 80\n");
                src->q_factor = 80;
            }
            if (dst->q_factor != src->q_factor)
                ret = jpege_gen_qt_by_qfactor(dst, &src->q_factor);

            dst->q_factor = src->q_factor;
            if (src->qf_min < 1 || src->qf_min > 99) {
                mpp_err_f("qf_min out of range, default set 1\n");
                src->qf_min = 1;
            }
            dst->qf_min = src->qf_min;
            if (src->qf_max < 1 || src->qf_max > 99) {
                mpp_err_f("qf_max out of range, default set 99\n");
                src->qf_max = 99;
            }
            dst->qf_max = src->qf_max;
            jpege_dbg_input("q_factor %d, qf_min %d, qf_max %d\n",
                            dst->q_factor, dst->qf_min, dst->qf_max);
        } else if (change & MPP_ENC_JPEG_CFG_CHANGE_QTABLE) {
            if (src->qtable_y && src->qtable_u && src->qtable_v) {
                if (NULL == dst->qtable_y)
                    dst->qtable_y = mpp_malloc(RK_U8, QUANTIZE_TABLE_SIZE);
                if (NULL == dst->qtable_u)
                    dst->qtable_u = mpp_malloc(RK_U8, QUANTIZE_TABLE_SIZE);

                if (NULL == dst->qtable_y || NULL == dst->qtable_u) {
                    mpp_err_f("qtable is null, malloc err\n");
                    return MPP_ERR_MALLOC;
                }
                /* check table value */
                if (src->qtable_u != src->qtable_v) {
                    RK_U32 i;

                    for (i = 0; i < QUANTIZE_TABLE_SIZE; i++) {
                        if (src->qtable_u[i] != src->qtable_v[i]) {
                            RK_U32 j;

                            jpege_dbg_input("qtable_u and qtable_v are different, use qtable_u\n");
                            for (j = 0; j < QUANTIZE_TABLE_SIZE; j++)
                                jpege_dbg_input("qtable_u[%d] %d qtable_v[%d] %d\n",
                                                j, src->qtable_u[j], j, src->qtable_v[j]);
                            break;
                        }
                    }
                }
                /* default use one chroma qtable, select qtable_u */
                memcpy(dst->qtable_y, src->qtable_y, QUANTIZE_TABLE_SIZE);
                memcpy(dst->qtable_u, src->qtable_u, QUANTIZE_TABLE_SIZE);

                if (rc->rc_mode != MPP_ENC_RC_MODE_FIXQP) {
                    mpp_log("setup qtable will change mode %s fixqp",
                            strof_rc_mode(rc->rc_mode));
                    rc->rc_mode = MPP_ENC_RC_MODE_FIXQP;
                }
            } else {
                mpp_err_f("invalid qtable y %p u %p v %p\n",
                          src->qtable_y, src->qtable_u, src->qtable_v);
                ret = MPP_ERR_NULL_PTR;
            }
        }

        if (ret) {
            mpp_err_f("failed to accept new rc config\n");
            *dst = bak;
        } else {
            jpege_dbg_ctrl("MPP_ENC_SET_CODEC_CFG change 0x%x jpeg quant %d q_factor %d\n",
                           change, dst->quant, dst->q_factor);
            dst->change = src->change;
        }

        dst->change = src->change;
    }

    return ret;
}